

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O1

void CheckStackTrace1(int i)

{
  bool bVar1;
  void *ra;
  CheckOpString local_70;
  LogMessage local_68;
  
  if (expected_range[5].start < ra) {
    local_70.str_ = (string *)0x0;
  }
  else {
    local_70.str_ =
         google::MakeCheckOpString<void_const*,void*>
                   (&expected_range[5].start,(void **)&stack0xffffffffffffff88,
                    "(&expected_range[5])->start < ra");
  }
  if (local_70.str_ == (string *)0x0) {
    if (expected_range[5].end < ra) {
      printf("Adjusting range from %p..%p to %p..%p\n",expected_range[5].start);
      expected_range[5].end = ra;
    }
    expected_range[4].start = (void *)0x108a99;
    expected_range[4].end = (void *)0x108aad;
    if (-1 < i) {
      do {
        CheckStackTrace2(i);
        bVar1 = 0 < i;
        i = i + -1;
      } while (bVar1);
    }
    return;
  }
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
             ,0xc6,&local_70);
  google::LogMessage::stream(&local_68);
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

static void ATTRIBUTE_NOINLINE CheckStackTrace1(int i) {
  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[5]);
  INIT_ADDRESS_RANGE(CheckStackTrace1, start, end, &expected_range[4]);
  DECLARE_ADDRESS_LABEL(start);
  for (int j = i; j >= 0; j--) {
    CheckStackTrace2(j);
  }
  DECLARE_ADDRESS_LABEL(end);
}